

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswLcorr.c
# Opt level: O3

int Ssw_ManSweepResimulate(Ssw_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  timespec ts;
  timespec local_30;
  
  iVar2 = clock_gettime(3,&local_30);
  if (iVar2 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  Ssw_ManSweepTransfer(p);
  Ssw_SmlSimulateOneFrame(p->pSml);
  iVar2 = Ssw_ClassesRefineConst1(p->ppClasses,1);
  iVar3 = Ssw_ClassesRefine(p->ppClasses,1);
  pVVar1 = p->vSimInfo;
  if (0 < pVVar1->nSize) {
    lVar5 = 0;
    do {
      *(undefined4 *)pVVar1->pArray[lVar5] = 0;
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar1->nSize);
  }
  p->nPatterns = 0;
  p->nSimRounds = p->nSimRounds + 1;
  iVar4 = clock_gettime(3,&local_30);
  if (iVar4 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  p->timeSimSat = p->timeSimSat + lVar5 + lVar6;
  return (int)(0 < iVar3 || 0 < iVar2);
}

Assistant:

int Ssw_ManSweepResimulate( Ssw_Man_t * p )
{
    int RetValue1, RetValue2;
    abctime clk = Abc_Clock();
    // transfer PI simulation information from storage
    Ssw_ManSweepTransfer( p );
    // simulate internal nodes
    Ssw_SmlSimulateOneFrame( p->pSml );
    // check equivalence classes
    RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 1 );
    RetValue2 = Ssw_ClassesRefine( p->ppClasses, 1 );
    // prepare simulation info for the next round
    Vec_PtrCleanSimInfo( p->vSimInfo, 0, 1 );
    p->nPatterns = 0;
    p->nSimRounds++;
p->timeSimSat += Abc_Clock() - clk;
    return RetValue1 > 0 || RetValue2 > 0;
}